

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderSwitchTests.cpp
# Opt level: O0

void __thiscall
deqp::ShaderSwitchCase::ShaderSwitchCase
          (ShaderSwitchCase *this,Context *context,char *name,char *description,bool isVertexCase,
          char *vtxSource,char *fragSource,ShaderEvalFunc evalFunc)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  char *vtxSource_local;
  bool isVertexCase_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderSwitchCase *this_local;
  
  testCtx = deqp::Context::getTestContext(context);
  renderCtx = deqp::Context::getRenderContext(context);
  ctxInfo = deqp::Context::getContextInfo(context);
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,description,isVertexCase,
             evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderSwitchCase_03265d30;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,vtxSource);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,fragSource);
  return;
}

Assistant:

ShaderSwitchCase::ShaderSwitchCase(Context& context, const char* name, const char* description, bool isVertexCase,
								   const char* vtxSource, const char* fragSource, ShaderEvalFunc evalFunc)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name,
					   description, isVertexCase, evalFunc)
{
	m_vertShaderSource = vtxSource;
	m_fragShaderSource = fragSource;
}